

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_clusterizer.h
# Opt level: O1

void __thiscall
crnlib::clusterizer<crnlib::vec<2U,_float>_>::insert_heap
          (clusterizer<crnlib::vec<2U,_float>_> *this,uint node_index)

{
  float fVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint *puVar5;
  bool bVar6;
  ulong uVar7;
  ulong uVar8;
  
  fVar1 = (this->m_nodes).m_p[node_index].m_variance;
  uVar2 = this->m_heap_size;
  uVar4 = uVar2 + 1;
  uVar7 = (ulong)uVar4;
  this->m_heap_size = uVar4;
  uVar3 = (this->m_heap).m_size;
  if ((uVar3 <= uVar4) && (uVar4 = uVar2 + 2, uVar3 != uVar4)) {
    if (uVar3 <= uVar4) {
      if ((this->m_heap).m_capacity < uVar4) {
        elemental_vector::increase_capacity
                  ((elemental_vector *)&this->m_heap,uVar4,uVar3 == uVar2 + 1,4,(object_mover)0x0,
                   false);
      }
      uVar3 = (this->m_heap).m_size;
      memset((this->m_heap).m_p + uVar3,0,(ulong)(uVar4 - uVar3) << 2);
    }
    (this->m_heap).m_size = uVar4;
  }
  do {
    if ((uint)uVar7 < 2) {
LAB_00150a67:
      bVar6 = false;
      uVar8 = uVar7;
    }
    else {
      uVar8 = uVar7 >> 1;
      puVar5 = (this->m_heap).m_p;
      uVar4 = puVar5[uVar8];
      if (fVar1 < (this->m_nodes).m_p[uVar4].m_variance) goto LAB_00150a67;
      puVar5[uVar7] = uVar4;
      bVar6 = true;
    }
    uVar7 = uVar8;
    if (!bVar6) {
      (this->m_heap).m_p[uVar8] = node_index;
      return;
    }
  } while( true );
}

Assistant:

void insert_heap(uint node_index) {
    const float variance = m_nodes[node_index].m_variance;
    uint pos = ++m_heap_size;

    if (m_heap_size >= m_heap.size())
      m_heap.resize(m_heap_size + 1);

    for (;;) {
      uint parent = pos >> 1;
      if (!parent)
        break;

      float parent_variance = m_nodes[m_heap[parent]].m_variance;
      if (parent_variance > variance)
        break;

      m_heap[pos] = m_heap[parent];

      pos = parent;
    }

    m_heap[pos] = node_index;
  }